

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::HasPackageReferences(cmGeneratorTarget *this)

{
  bool bVar1;
  string *psVar2;
  string local_38;
  
  bVar1 = IsInBuildSystem(this);
  if (bVar1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"VS_PACKAGE_REFERENCES","");
    psVar2 = (string *)GetProperty(this,&local_38);
    if (psVar2 == (string *)0x0) {
      psVar2 = &cmValue::Empty_abi_cxx11_;
    }
    bVar1 = psVar2->_M_string_length != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HasPackageReferences() const
{
  return this->IsInBuildSystem() &&
    !this->GetProperty("VS_PACKAGE_REFERENCES")->empty();
}